

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O1

bool igIsMouseHoveringRect(ImVec2 r_min,ImVec2 r_max,bool clip)

{
  bool bVar1;
  ImVec2 local_10;
  ImVec2 local_8;
  
  local_10 = r_max;
  local_8 = r_min;
  bVar1 = ImGui::IsMouseHoveringRect(&local_8,&local_10,clip);
  return bVar1;
}

Assistant:

CIMGUI_API int _igIsMouseHoveringRect (ImVec2 const *larg1, ImVec2 const *larg2, int larg3) {
  int lresult = (int)0 ;
  ImVec2 arg1 ;
  ImVec2 arg2 ;
  bool arg3 ;
  bool result;
  
  arg1 = *larg1;
  arg2 = *larg2;
  arg3 = (bool)larg3;
  try {
    result = (bool)igIsMouseHoveringRect(arg1,arg2,arg3);
    lresult = (int)result;
    return lresult;
  } catch (...) {
    return (int)0;
  }
}